

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Remove(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  bool bVar1;
  AActor *pAVar2;
  VMValue *pVVar3;
  int flags;
  char *pcVar4;
  PClassActor *filter;
  FName local_34;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003efc17;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003efbfb:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003efc17:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18b6,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar2 == (AActor *)0x0) goto LAB_003efb14;
    bVar1 = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003efc17;
    }
  }
  else {
    if (pAVar2 != (AActor *)0x0) goto LAB_003efbfb;
LAB_003efb14:
    pAVar2 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
LAB_003efc3f:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18b7,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar4 = "param[paramnum].Type == REGT_INT";
    goto LAB_003efc3f;
  }
  if ((uint)numparam < 3) {
    pVVar3 = defaultparam->Array;
    if (pVVar3[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003efc86;
    }
    flags = pVVar3[2].field_0.i;
LAB_003efb5c:
    if (pVVar3[3].field_0.field_3.Type != '\x03') {
LAB_003efc04:
      pcVar4 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003efca5:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18b9,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    filter = (PClassActor *)pVVar3[3].field_0.field_1.a;
    if (pVVar3[3].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003efc04;
      filter = (PClassActor *)0x0;
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
LAB_003efc86:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18b8,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    flags = param[2].field_0.i;
    if (numparam == 3) {
      pVVar3 = defaultparam->Array;
      goto LAB_003efb5c;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[3].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar4 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003efca5;
    }
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003efc5e;
      }
      goto LAB_003efbc6;
    }
    pVVar3 = defaultparam->Array;
  }
  if (pVVar3[4].field_0.field_3.Type != '\0') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003efc5e:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18ba,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003efbc6:
  pAVar2 = COPY_AAPTR(pAVar2,param[1].field_0.i);
  if (pAVar2 != (AActor *)0x0) {
    DoRemove(pAVar2,flags,filter,&local_34);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Remove)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(removee);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	AActor *reference = COPY_AAPTR(self, removee);
	if (reference != NULL)
	{
		DoRemove(reference, flags, filter, species);
	}
	return 0;
}